

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_posix_init.c
# Opt level: O1

void ngx_os_status(ngx_log_t *log)

{
  if (5 < log->log_level) {
    ngx_log_error_core(6,log,0,"nginx/1.12.2");
  }
  if (5 < log->log_level) {
    ngx_log_error_core(6,log,0,"built by clang 9.0.0 (clang-900.0.38)");
  }
  ngx_os_specific_status(log);
  if (5 < log->log_level) {
    ngx_log_error_core(6,log,0,"getrlimit(RLIMIT_NOFILE): %r:%r",rlmt.rlim_cur,rlmt.rlim_max);
    return;
  }
  return;
}

Assistant:

void
ngx_os_status(ngx_log_t *log)
{
    ngx_log_error(NGX_LOG_NOTICE, log, 0, NGINX_VER_BUILD);

#ifdef NGX_COMPILER
    ngx_log_error(NGX_LOG_NOTICE, log, 0, "built by " NGX_COMPILER);
#endif

#if (NGX_HAVE_OS_SPECIFIC_INIT)
    ngx_os_specific_status(log);
#endif

    ngx_log_error(NGX_LOG_NOTICE, log, 0,
                  "getrlimit(RLIMIT_NOFILE): %r:%r",
                  rlmt.rlim_cur, rlmt.rlim_max);
}